

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::RecordPropertyEnumEvent
          (EventLog *this,BOOL returnCode,PropertyId pid,PropertyAttributes attributes,
          JavascriptString *propertyName)

{
  BOOL BVar1;
  charcount_t length;
  PropertyEnumStepEventLogEntry *pPVar2;
  char16 *str;
  PropertyEnumStepEventLogEntry *peEvent;
  JavascriptString *propertyName_local;
  PropertyAttributes attributes_local;
  PropertyId pid_local;
  BOOL returnCode_local;
  EventLog *this_local;
  
  if ((returnCode == 0) || (BVar1 = Js::IsInternalPropertyId(pid), BVar1 == 0)) {
    pPVar2 = RecordGetInitializedEvent_DataOnly<TTD::NSLogEvents::PropertyEnumStepEventLogEntry,(TTD::NSLogEvents::EventKind)8>
                       (this);
    pPVar2->ReturnCode = returnCode;
    pPVar2->Pid = pid;
    pPVar2->Attributes = attributes;
    InitializeAsNullPtrTTString(&pPVar2->PropertyString);
    if (returnCode != 0) {
      str = Js::JavascriptString::GetString(propertyName);
      length = Js::JavascriptString::GetLength(propertyName);
      SlabAllocatorBase<8>::CopyStringIntoWLength
                (&this->m_eventSlabAllocator,str,length,&pPVar2->PropertyString);
    }
  }
  return;
}

Assistant:

void EventLog::RecordPropertyEnumEvent(BOOL returnCode, Js::PropertyId pid, Js::PropertyAttributes attributes, Js::JavascriptString* propertyName)
    {
        //When we replay we can just skip this pid cause it should never matter -- but if return code is false then we need to record the "at end" info
        if(returnCode && Js::IsInternalPropertyId(pid))
        {
            return;
        }

        NSLogEvents::PropertyEnumStepEventLogEntry* peEvent = this->RecordGetInitializedEvent_DataOnly<NSLogEvents::PropertyEnumStepEventLogEntry, NSLogEvents::EventKind::PropertyEnumTag>();
        peEvent->ReturnCode = returnCode;
        peEvent->Pid = pid;
        peEvent->Attributes = attributes;

        InitializeAsNullPtrTTString(peEvent->PropertyString);
#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
        if(returnCode)
        {
            this->m_eventSlabAllocator.CopyStringIntoWLength(propertyName->GetString(), propertyName->GetLength(), peEvent->PropertyString);
        }
#else
        if(returnCode && pid == Js::Constants::NoProperty)
        {
            this->m_eventSlabAllocator.CopyStringIntoWLength(propertyName->GetString(), propertyName->GetLength(), peEvent->PropertyString);
        }
#endif

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteEnumAction(this->m_eventTimeCtr - 1, returnCode, pid, attributes, propertyName);
#endif
    }